

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O3

void __thiscall
OpenMPAffinityClause::addIteratorsDefinitionClass
          (OpenMPAffinityClause *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *_iterator_definition)

{
  pointer *pppvVar1;
  iterator __position;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_8;
  
  __position._M_current =
       (this->iterators_definition_class).
       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->iterators_definition_class).
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = _iterator_definition;
    std::
    vector<std::vector<char_const*,std::allocator<char_const*>>*,std::allocator<std::vector<char_const*,std::allocator<char_const*>>*>>
    ::_M_realloc_insert<std::vector<char_const*,std::allocator<char_const*>>*const&>
              ((vector<std::vector<char_const*,std::allocator<char_const*>>*,std::allocator<std::vector<char_const*,std::allocator<char_const*>>*>>
                *)&this->iterators_definition_class,__position,&local_8);
  }
  else {
    *__position._M_current = _iterator_definition;
    pppvVar1 = &(this->iterators_definition_class).
                super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  return;
}

Assistant:

void addIteratorsDefinitionClass (std::vector<const char*>* _iterator_definition) { iterators_definition_class.push_back(_iterator_definition);}